

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

double beta_pq2s(pqpair pq,double aa,double bb)

{
  double local_70;
  double bound;
  double b;
  double a;
  double y;
  double x;
  double q;
  double p;
  int status;
  int which;
  double bb_local;
  double aa_local;
  pqpair pq_local;
  
  x = pq.q;
  q = pq.p;
  p._4_4_ = 2;
  if (0.0 < q) {
    if (0.0 < x) {
      y = 0.0;
      a = 1.0;
      bound = bb;
      b = aa;
      _status = bb;
      bb_local = aa;
      aa_local = q;
      pq_local.p = x;
      cdfbet((int *)((long)&p + 4),&q,&x,&y,&a,&b,&bound,(int *)&p,&local_70);
      pq_local.q = y;
    }
    else {
      pq_local.q = 1.0;
    }
  }
  else {
    pq_local.q = 0.0;
  }
  return pq_local.q;
}

Assistant:

static double beta_pq2s( pqpair pq , double aa , double bb )
{
   int which , status ;
   double p,q,x,y,a,b,bound ;

   which  = 2 ;
   p      = pq.p ; if( p <= 0.0 ) return 0.0 ;
   q      = pq.q ; if( q <= 0.0 ) return 1.0 ;
   x      = 0.0 ;
   y      = 1.0 ;
   a      = aa ;
   b      = bb ;

   cdfbet( &which , &p , &q , &x , &y , &a , &b ,  &status , &bound ) ;
   return x ;
}